

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O0

AuthKbdInt * auth_kbdint_prompts(AuthPolicy *ap,ptrlen username)

{
  void *pvVar1;
  char *pcVar2;
  server_instance *inst;
  AuthKbdInt *aki;
  AuthPolicy *ap_local;
  ptrlen username_local;
  
  if (ap->kbdint_state == 0) {
    username_local.len = (size_t)safemalloc(1,0x20,0);
    pcVar2 = dupstr("Initial double prompt");
    *(char **)username_local.len = pcVar2;
    pcVar2 = dupstr("First prompt should echo, second should not");
    *(char **)(username_local.len + 8) = pcVar2;
    *(undefined4 *)(username_local.len + 0x10) = 2;
    pvVar1 = safemalloc((long)*(int *)(username_local.len + 0x10),0x10,0);
    *(void **)(username_local.len + 0x18) = pvVar1;
    pcVar2 = dupstr("Echoey prompt: ");
    **(undefined8 **)(username_local.len + 0x18) = pcVar2;
    *(undefined1 *)(*(long *)(username_local.len + 0x18) + 8) = 1;
    pcVar2 = dupstr("Silent prompt: ");
    *(char **)(*(long *)(username_local.len + 0x18) + 0x10) = pcVar2;
    *(undefined1 *)(*(long *)(username_local.len + 0x18) + 0x18) = 0;
  }
  else if (ap->kbdint_state == 1) {
    username_local.len = (size_t)safemalloc(1,0x20,0);
    if ((*(byte *)(*(long *)(*(long *)&ap[1].kbdint_state + 0x10) + 0xbc) & 1) == 0) {
      pcVar2 = dupstr("Zero-prompt step");
      *(char **)username_local.len = pcVar2;
      pcVar2 = dupstr("Shouldn\'t see any prompts this time");
      *(char **)(username_local.len + 8) = pcVar2;
    }
    else {
      pcVar2 = dupstr("");
      *(char **)username_local.len = pcVar2;
      pcVar2 = dupstr("");
      *(char **)(username_local.len + 8) = pcVar2;
    }
    *(undefined4 *)(username_local.len + 0x10) = 0;
    *(undefined8 *)(username_local.len + 0x18) = 0;
  }
  else {
    ap->kbdint_state = 0;
    username_local.len = 0;
  }
  return (AuthKbdInt *)username_local.len;
}

Assistant:

AuthKbdInt *auth_kbdint_prompts(AuthPolicy *ap, ptrlen username)
{
    AuthKbdInt *aki;

    switch (ap->kbdint_state) {
      case 0:
        aki = snew(AuthKbdInt);
        aki->title = dupstr("Initial double prompt");
        aki->instruction =
            dupstr("First prompt should echo, second should not");
        aki->nprompts = 2;
        aki->prompts = snewn(aki->nprompts, AuthKbdIntPrompt);
        aki->prompts[0].prompt = dupstr("Echoey prompt: ");
        aki->prompts[0].echo = true;
        aki->prompts[1].prompt = dupstr("Silent prompt: ");
        aki->prompts[1].echo = false;
        return aki;
      case 1: {
        struct server_instance *inst = container_of(
            ap, struct server_instance, ap);
        aki = snew(AuthKbdInt);
        if (inst->cfg->ssc->stunt_allow_trivial_ki_auth) {
            aki->title = dupstr("");
            aki->instruction = dupstr("");
        } else {
            aki->title = dupstr("Zero-prompt step");
            aki->instruction = dupstr("Shouldn't see any prompts this time");
        }
        aki->nprompts = 0;
        aki->prompts = NULL;
        return aki;
      }
      default:
        ap->kbdint_state = 0;
        return NULL;
    }
}